

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenTableBuilders
          (LobsterGenerator *this,StructDef *struct_def,string *code_ptr)

{
  Value *type;
  BaseType BVar1;
  FieldDef *pFVar2;
  pointer ppFVar3;
  string *psVar4;
  pointer ppFVar5;
  size_t t;
  pointer ppFVar6;
  undefined1 local_2d0 [32];
  string *local_2b0;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  pointer local_268;
  StructDef *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  pointer local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  EscapeKeyword(&local_2a8,this,(string *)struct_def);
  std::operator+(&local_288,"struct ",&local_2a8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                 &local_288,"Builder:\n    b_:flatbuffers.builder\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  NumToString<unsigned_long>
            (&local_2a8,
             (long)(struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_288,"    def start():\n        b_.StartObject(",&local_2a8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                 &local_288,")\n        return this\n");
  local_2b0 = code_ptr;
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  ppFVar6 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar5 = ppFVar6;
  local_260 = struct_def;
  for (; psVar4 = local_2b0,
      ppFVar6 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar6 = ppFVar6 + 1) {
    pFVar2 = *ppFVar6;
    if (pFVar2->deprecated == false) {
      ppFVar3 = (struct_def->fields).vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_268 = ppFVar5;
      local_1f8 = ppFVar6;
      EscapeKeyword(&local_190,this,(string *)pFVar2);
      std::operator+(&local_d0,"    def add_",&local_190);
      std::operator+(&local_1f0,&local_d0,"(");
      EscapeKeyword(&local_f0,this,(string *)pFVar2);
      std::operator+(&local_170,&local_1f0,&local_f0);
      std::operator+(&local_1d0,&local_170,":");
      type = &pFVar2->value;
      LobsterType_abi_cxx11_(&local_110,this,&type->type);
      std::operator+(&local_1b0,&local_1d0,&local_110);
      std::operator+(&local_258,&local_1b0,"):\n        b_.Prepend");
      GenMethod_abi_cxx11_(&local_130,this,&type->type);
      std::operator+(&local_218,&local_258,&local_130);
      std::operator+(&local_238,&local_218,"Slot(");
      NumToString<long>(&local_b0,(long)ppFVar5 - (long)ppFVar3 >> 3);
      std::operator+(&local_2a8,&local_238,&local_b0);
      std::operator+(&local_288,&local_2a8,", ");
      EscapeKeyword(&local_150,this,(string *)pFVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                     &local_288,&local_150);
      std::__cxx11::string::append((string *)local_2b0);
      std::__cxx11::string::~string((string *)local_2d0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_190);
      struct_def = local_260;
      if (((type->type).base_type - BASE_TYPE_UTYPE < 0xc) && (pFVar2->presence != kOptional)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2d0,", ",&(pFVar2->value).constant);
        std::__cxx11::string::append((string *)local_2b0);
        std::__cxx11::string::~string((string *)local_2d0);
      }
      std::__cxx11::string::append((char *)local_2b0);
      ppFVar6 = local_1f8;
      ppFVar5 = local_268;
    }
    ppFVar5 = ppFVar5 + 1;
  }
  std::__cxx11::string::append((char *)local_2b0);
  for (ppFVar6 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar6 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar6 = ppFVar6 + 1) {
    pFVar2 = *ppFVar6;
    if ((pFVar2->deprecated == false) &&
       ((BVar1 = (pFVar2->value).type.base_type, BVar1 == BASE_TYPE_VECTOR64 ||
        (BVar1 == BASE_TYPE_VECTOR)))) {
      EscapeKeyword(&local_218,this,(string *)struct_def);
      std::operator+(&local_238,"def ",&local_218);
      std::operator+(&local_2a8,&local_238,"Start");
      EscapeKeyword(&local_1b0,this,(string *)pFVar2);
      ConvertCase(&local_258,&local_1b0,kUpperCamel,kSnake);
      std::operator+(&local_288,&local_2a8,&local_258);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                     &local_288,"Vector(b_:flatbuffers.builder, n_:int):\n    b_.StartVector(");
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::~string((string *)local_2d0);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
      local_2d0._0_4_ = (pFVar2->value).type.element;
      local_2d0._24_2_ = (pFVar2->value).type.fixed_length;
      local_2d0._4_4_ = BASE_TYPE_NONE;
      local_2d0._8_8_ = (pFVar2->value).type.struct_def;
      local_2d0._16_8_ = (pFVar2->value).type.enum_def;
      ppFVar5 = (pointer)InlineAlignment((Type *)local_2d0);
      t = InlineSize((Type *)local_2d0);
      NumToString<unsigned_long>(&local_218,t);
      std::operator+(&local_238,&local_218,", n_, ");
      local_268 = ppFVar5;
      NumToString<unsigned_long>(&local_258,(unsigned_long)ppFVar5);
      std::operator+(&local_2a8,&local_238,&local_258);
      std::operator+(&local_288,&local_2a8,")\n");
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
      if ((local_2d0._0_4_ != BASE_TYPE_STRUCT) || (*(bool *)(local_2d0._8_8_ + 0x110) == false)) {
        EscapeKeyword(&local_110,this,(string *)local_260);
        std::operator+(&local_f0,"def ",&local_110);
        std::operator+(&local_190,&local_f0,"Create");
        EscapeKeyword(&local_b0,this,(string *)pFVar2);
        ConvertCase(&local_130,&local_b0,kUpperCamel,kSnake);
        std::operator+(&local_d0,&local_190,&local_130);
        std::operator+(&local_1f0,&local_d0,"Vector(b_:flatbuffers.builder, v_:[");
        LobsterType_abi_cxx11_(&local_150,this,(Type *)local_2d0);
        std::operator+(&local_170,&local_1f0,&local_150);
        std::operator+(&local_1d0,&local_170,"]):\n    b_.StartVector(");
        NumToString<unsigned_long>(&local_50,t);
        std::operator+(&local_1b0,&local_1d0,&local_50);
        std::operator+(&local_258,&local_1b0,", v_.length, ");
        NumToString<unsigned_long>(&local_70,(unsigned_long)local_268);
        std::operator+(&local_218,&local_258,&local_70);
        std::operator+(&local_238,&local_218,")\n    reverse(v_) e_: b_.Prepend");
        GenMethod_abi_cxx11_(&local_90,this,(Type *)local_2d0);
        std::operator+(&local_2a8,&local_238,&local_90);
        std::operator+(&local_288,&local_2a8,"(e_)\n    return b_.EndVector(v_.length)\n");
        std::__cxx11::string::append((string *)psVar4);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
      }
      std::__cxx11::string::append((char *)psVar4);
      struct_def = local_260;
    }
  }
  return;
}

Assistant:

void GenTableBuilders(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "struct " + NormalizedName(struct_def) +
            "Builder:\n    b_:flatbuffers.builder\n";
    code += "    def start():\n        b_.StartObject(" +
            NumToString(struct_def.fields.vec.size()) +
            ")\n        return this\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      auto offset = it - struct_def.fields.vec.begin();
      code += "    def add_" + NormalizedName(field) + "(" +
              NormalizedName(field) + ":" + LobsterType(field.value.type) +
              "):\n        b_.Prepend" + GenMethod(field.value.type) + "Slot(" +
              NumToString(offset) + ", " + NormalizedName(field);
      if (IsScalar(field.value.type.base_type) && !field.IsOptional())
        code += ", " + field.value.constant;
      code += ")\n        return this\n";
    }
    code += "    def end():\n        return b_.EndObject()\n\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (IsVector(field.value.type)) {
        code += "def " + NormalizedName(struct_def) + "Start" +
                ConvertCase(NormalizedName(field), Case::kUpperCamel) +
                "Vector(b_:flatbuffers.builder, n_:int):\n    b_.StartVector(";
        auto vector_type = field.value.type.VectorType();
        auto alignment = InlineAlignment(vector_type);
        auto elem_size = InlineSize(vector_type);
        code +=
            NumToString(elem_size) + ", n_, " + NumToString(alignment) + ")\n";
        if (vector_type.base_type != BASE_TYPE_STRUCT ||
            !vector_type.struct_def->fixed) {
          code += "def " + NormalizedName(struct_def) + "Create" +
                  ConvertCase(NormalizedName(field), Case::kUpperCamel) +
                  "Vector(b_:flatbuffers.builder, v_:[" +
                  LobsterType(vector_type) + "]):\n    b_.StartVector(" +
                  NumToString(elem_size) + ", v_.length, " +
                  NumToString(alignment) + ")\n    reverse(v_) e_: b_.Prepend" +
                  GenMethod(vector_type) +
                  "(e_)\n    return b_.EndVector(v_.length)\n";
        }
        code += "\n";
      }
    }
  }